

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,xray_re::xr_writer::f_w_const<xray_re::xr_mesh>>
          (xr_writer *this,
          vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_> *container,
          f_w_const<xray_re::xr_mesh> write)

{
  pointer ppxVar1;
  code *pcVar2;
  long in_RCX;
  code *in_RDX;
  uint32_t id;
  uint32_t id_00;
  long *plVar3;
  pointer ppxVar4;
  
  ppxVar1 = (container->super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  id_00 = 0;
  for (ppxVar4 = (container->
                 super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppxVar4 != ppxVar1; ppxVar4 = ppxVar4 + 1
      ) {
    open_chunk(this,id_00);
    plVar3 = (long *)((long)&(*ppxVar4)->_vptr_xr_mesh + in_RCX);
    pcVar2 = in_RDX;
    if (((ulong)in_RDX & 1) != 0) {
      pcVar2 = *(code **)(in_RDX + *plVar3 + -1);
    }
    (*pcVar2)(plVar3,this);
    close_chunk(this);
    id_00 = id_00 + 1;
  }
  return;
}

Assistant:

inline void xr_writer::w_chunks(const T& container, F write)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_chunk(id++);
		write(*it, *this);
		close_chunk();
	}
}